

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hair_geometry_device.cpp
# Opt level: O0

Vec3fa embree::occluded(RTCTraversable traversable,RayQueryContext *context,Ray *ray)

{
  long in_RCX;
  long in_RDX;
  undefined8 in_RSI;
  undefined4 *in_RDI;
  undefined8 in_XMM1_Qa;
  Vec3fa VVar1;
  RTCOccludedArguments args;
  Vec3fa transparency;
  undefined4 local_c8;
  undefined4 local_c4;
  code *local_b8;
  undefined8 local_b0;
  undefined4 local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  long local_98;
  long local_90;
  undefined4 local_64;
  undefined4 *local_60;
  undefined4 *local_48;
  undefined4 local_18;
  undefined4 uStack_14;
  undefined4 uStack_10;
  undefined4 uStack_c;
  undefined4 uStack_8;
  
  local_60 = &local_a8;
  local_64 = 0x3f800000;
  uStack_8 = 0x3f800000;
  local_18 = 0x3f800000;
  uStack_14 = 0x3f800000;
  uStack_10 = 0x3f800000;
  uStack_c = 0x3f800000;
  local_a8 = 0x3f800000;
  uStack_a4 = 0x3f800000;
  uStack_a0 = 0x3f800000;
  uStack_9c = 0x3f800000;
  *(undefined4 **)(in_RDX + 8) = &local_a8;
  *(undefined4 *)(in_RCX + 0x48) = 0xffffffff;
  *(undefined4 *)(in_RCX + 0x44) = 0xffffffff;
  *(undefined4 *)(in_RCX + 0x24) = 0xffffffff;
  local_48 = &local_c8;
  local_c8 = 0;
  local_b0 = 0;
  local_c4 = 0x1000042;
  local_b8 = occlusionFilter;
  local_98 = in_RCX;
  local_90 = in_RDX;
  rtcTraversableOccluded1(in_RSI,in_RCX,&local_c8);
  *(undefined8 *)(local_90 + 8) = 0;
  if (0.0 < *(float *)(local_98 + 0x20) || *(float *)(local_98 + 0x20) == 0.0) {
    *in_RDI = local_a8;
    in_RDI[1] = uStack_a4;
    in_RDI[2] = uStack_a0;
    in_RDI[3] = uStack_9c;
  }
  else {
    local_a8 = 0;
    uStack_a4 = 0;
    *in_RDI = 0;
    in_RDI[1] = 0;
    in_RDI[2] = 0;
    in_RDI[3] = 0;
  }
  VVar1.field_0.m128[1] = (float)uStack_a4;
  VVar1.field_0.m128[0] = (float)local_a8;
  VVar1.field_0._8_8_ = in_XMM1_Qa;
  return (Vec3fa)VVar1.field_0;
}

Assistant:

Vec3fa occluded(RTCTraversable traversable, RayQueryContext* context, Ray& ray)
{
  Vec3fa transparency = Vec3fa(1.0f);
  context->userRayExt = &transparency;
  
  ray.geomID = RTC_INVALID_GEOMETRY_ID;
  ray.primID = RTC_INVALID_GEOMETRY_ID;
  ray.mask = -1;

  RTCOccludedArguments args;
  rtcInitOccludedArguments(&args);
  args.context = &context->context;
  args.feature_mask = (RTCFeatureFlags) (FEATURE_MASK);
  args.filter = occlusionFilter;
  
  rtcTraversableOccluded1(traversable,RTCRay_(ray),&args);
  context->userRayExt = nullptr;

  if (ray.tfar < 0) return Vec3fa(0.0f);
  else              return transparency;
}